

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

Status kwssys::SystemTools::RemoveADirectory(string *source)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  unsigned_long uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong dindex;
  mode_t mode;
  Directory dir;
  string fullPath;
  stat fs;
  mode_t local_ec;
  Directory local_e8;
  string local_e0;
  stat local_c0;
  
  local_ec = 0;
  SVar4 = GetPermissions(source,&local_ec);
  if (SVar4.Kind_ == Success) {
    local_ec = local_ec | 0x180;
    SetPermissions(source,local_ec,false);
  }
  Directory::Directory(&local_e8);
  SVar4 = Directory::Load(&local_e8,source,(string *)0x0);
  uVar7 = (ulong)SVar4 >> 0x20;
  if (SVar4.Kind_ == Success) {
    dindex = 0;
    while( true ) {
      uVar5 = Directory::GetNumberOfFiles(&local_e8);
      if (uVar5 <= dindex) break;
      pcVar6 = Directory::GetFile(&local_e8,dindex);
      iVar3 = strcmp(pcVar6,".");
      if (iVar3 != 0) {
        pcVar6 = Directory::GetFile(&local_e8,dindex);
        iVar3 = strcmp(pcVar6,"..");
        if (iVar3 != 0) {
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          pcVar1 = (source->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar1,pcVar1 + source->_M_string_length);
          std::__cxx11::string::append((char *)&local_e0);
          Directory::GetFile(&local_e8,dindex);
          std::__cxx11::string::append((char *)&local_e0);
          bVar2 = FileIsDirectory(&local_e0);
          if (bVar2) {
            iVar3 = lstat(local_e0._M_dataplus._M_p,&local_c0);
            if ((iVar3 == 0) && ((local_c0.st_mode & 0xf000) == 0xa000)) goto LAB_00164912;
            SVar4 = RemoveADirectory(&local_e0);
          }
          else {
LAB_00164912:
            SVar4 = RemoveFile(&local_e0);
          }
          uVar7 = (ulong)SVar4 >> 0x20;
          if (SVar4.Kind_ != Success) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            goto LAB_00164980;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
        }
      }
      dindex = dindex + 1;
    }
    iVar3 = rmdir((source->_M_dataplus)._M_p);
    if (iVar3 != 0) {
      SVar4 = Status::POSIX_errno();
      uVar7 = (ulong)SVar4 >> 0x20;
    }
  }
LAB_00164980:
  Directory::~Directory(&local_e8);
  return (Status)((ulong)SVar4 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

Status SystemTools::RemoveADirectory(std::string const& source)
{
  // Add read and write permission to the directory so we can read
  // and modify its content to remove files and directories from it.
  mode_t mode = 0;
  if (SystemTools::GetPermissions(source, mode)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IREAD | S_IWRITE;
#else
    mode |= S_IRUSR | S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
  }

  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }

  size_t fileNum;
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath) &&
          !SystemTools::FileIsSymlink(fullPath)) {
        status = SystemTools::RemoveADirectory(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::RemoveFile(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  if (Rmdir(source) != 0) {
    status = Status::POSIX_errno();
  }
  return status;
}